

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3AlterBeginAddColumn(Parse *pParse,SrcList *pSrc)

{
  uint uVar1;
  undefined8 *puVar2;
  short sVar3;
  sqlite3 *db;
  Schema *pSVar4;
  int iVar5;
  uint uVar6;
  Table *pTab;
  Table *pTVar7;
  Column *pCVar8;
  Schema **ppSVar9;
  long lVar10;
  char *pcVar11;
  long lVar12;
  long lVar13;
  
  db = pParse->db;
  if (db->mallocFailed == '\0') {
    pTab = sqlite3LocateTableItem(pParse,0,pSrc->a);
    if (pTab != (Table *)0x0) {
      if (pTab->nModuleArg == 0) {
        if (pTab->pSelect == (Select *)0x0) {
          iVar5 = isAlterableTable(pParse,pTab);
          if (iVar5 == 0) {
            if (pTab->pSchema == (Schema *)0x0) {
              lVar10 = -1000000;
            }
            else {
              lVar10 = -0x100000000;
              ppSVar9 = &db->aDb->pSchema;
              do {
                lVar10 = lVar10 + 0x100000000;
                pSVar4 = *ppSVar9;
                ppSVar9 = ppSVar9 + 4;
              } while (pSVar4 != pTab->pSchema);
              lVar10 = lVar10 >> 0x20;
            }
            pTVar7 = (Table *)sqlite3DbMallocZero(db,0x80);
            if (pTVar7 != (Table *)0x0) {
              pParse->pNewTable = pTVar7;
              pTVar7->nTabRef = 1;
              sVar3 = pTab->nCol;
              pTVar7->nCol = sVar3;
              uVar1 = (int)sVar3 - 1;
              uVar6 = (int)sVar3 + 6;
              if (-1 < (int)uVar1) {
                uVar6 = uVar1;
              }
              pCVar8 = (Column *)
                       sqlite3DbMallocZero(db,(long)(int)(uVar6 & 0xfffffff8) * 0x20 + 0x100);
              pTVar7->aCol = pCVar8;
              pcVar11 = sqlite3MPrintf(db,"sqlite_altertab_%s",pTab->zName);
              pTVar7->zName = pcVar11;
              if (pcVar11 != (char *)0x0 && pTVar7->aCol != (Column *)0x0) {
                memcpy(pTVar7->aCol,pTab->aCol,(long)pTVar7->nCol << 5);
                if (0 < pTVar7->nCol) {
                  lVar13 = 0;
                  lVar12 = 0;
                  do {
                    pCVar8 = pTVar7->aCol;
                    pcVar11 = sqlite3DbStrDup(db,*(char **)((long)&pCVar8->zName + lVar13));
                    *(char **)((long)&pCVar8->zName + lVar13) = pcVar11;
                    lVar12 = lVar12 + 1;
                    puVar2 = (undefined8 *)((long)&pCVar8->pDflt + lVar13);
                    *puVar2 = 0;
                    puVar2[1] = 0;
                    lVar13 = lVar13 + 0x20;
                  } while (lVar12 < pTVar7->nCol);
                }
                pTVar7->pSchema = db->aDb[lVar10].pSchema;
                pTVar7->addColOffset = pTab->addColOffset;
                pTVar7->nTabRef = 1;
              }
            }
          }
          goto LAB_00192301;
        }
        pcVar11 = "Cannot add a column to a view";
      }
      else {
        pcVar11 = "virtual tables may not be altered";
      }
      sqlite3ErrorMsg(pParse,pcVar11);
    }
  }
LAB_00192301:
  sqlite3SrcListDelete(db,pSrc);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AlterBeginAddColumn(Parse *pParse, SrcList *pSrc){
  Table *pNew;
  Table *pTab;
  int iDb;
  int i;
  int nAlloc;
  sqlite3 *db = pParse->db;

  /* Look up the table being altered. */
  assert( pParse->pNewTable==0 );
  assert( sqlite3BtreeHoldsAllMutexes(db) );
  if( db->mallocFailed ) goto exit_begin_add_column;
  pTab = sqlite3LocateTableItem(pParse, 0, &pSrc->a[0]);
  if( !pTab ) goto exit_begin_add_column;

#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( IsVirtual(pTab) ){
    sqlite3ErrorMsg(pParse, "virtual tables may not be altered");
    goto exit_begin_add_column;
  }
#endif

  /* Make sure this is not an attempt to ALTER a view. */
  if( pTab->pSelect ){
    sqlite3ErrorMsg(pParse, "Cannot add a column to a view");
    goto exit_begin_add_column;
  }
  if( SQLITE_OK!=isAlterableTable(pParse, pTab) ){
    goto exit_begin_add_column;
  }

  assert( pTab->addColOffset>0 );
  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);

  /* Put a copy of the Table struct in Parse.pNewTable for the
  ** sqlite3AddColumn() function and friends to modify.  But modify
  ** the name by adding an "sqlite_altertab_" prefix.  By adding this
  ** prefix, we insure that the name will not collide with an existing
  ** table because user table are not allowed to have the "sqlite_"
  ** prefix on their name.
  */
  pNew = (Table*)sqlite3DbMallocZero(db, sizeof(Table));
  if( !pNew ) goto exit_begin_add_column;
  pParse->pNewTable = pNew;
  pNew->nTabRef = 1;
  pNew->nCol = pTab->nCol;
  assert( pNew->nCol>0 );
  nAlloc = (((pNew->nCol-1)/8)*8)+8;
  assert( nAlloc>=pNew->nCol && nAlloc%8==0 && nAlloc-pNew->nCol<8 );
  pNew->aCol = (Column*)sqlite3DbMallocZero(db, sizeof(Column)*nAlloc);
  pNew->zName = sqlite3MPrintf(db, "sqlite_altertab_%s", pTab->zName);
  if( !pNew->aCol || !pNew->zName ){
    assert( db->mallocFailed );
    goto exit_begin_add_column;
  }
  memcpy(pNew->aCol, pTab->aCol, sizeof(Column)*pNew->nCol);
  for(i=0; i<pNew->nCol; i++){
    Column *pCol = &pNew->aCol[i];
    pCol->zName = sqlite3DbStrDup(db, pCol->zName);
    pCol->zColl = 0;
    pCol->pDflt = 0;
  }
  pNew->pSchema = db->aDb[iDb].pSchema;
  pNew->addColOffset = pTab->addColOffset;
  pNew->nTabRef = 1;

exit_begin_add_column:
  sqlite3SrcListDelete(db, pSrc);
  return;
}